

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeComputeFreeSpace(MemPage *pPage)

{
  byte bVar1;
  uint uVar2;
  u8 *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  
  puVar3 = pPage->aData;
  uVar2 = pPage->pBt->usableSize;
  bVar1 = pPage->hdrOffset;
  uVar7 = ((uint)puVar3[(ulong)bVar1 + 5] * 0x100 + (uint)puVar3[(ulong)bVar1 + 6]) - 1 & 0xffff;
  uVar8 = *(ushort *)(puVar3 + (ulong)bVar1 + 1) << 8 | *(ushort *)(puVar3 + (ulong)bVar1 + 1) >> 8;
  iVar5 = puVar3[(ulong)bVar1 + 7] + uVar7 + 1;
  if (uVar8 != 0) {
    if (uVar8 <= uVar7) {
      iVar5 = 0x10cfe;
      goto LAB_00140061;
    }
    uVar7 = (uint)uVar8;
    do {
      uVar6 = uVar7;
      if ((int)(uVar2 - 4) < (int)uVar6) {
        iVar5 = 0x10d03;
        goto LAB_00140061;
      }
      uVar8 = *(ushort *)(puVar3 + uVar6) << 8 | *(ushort *)(puVar3 + uVar6) >> 8;
      uVar9 = *(ushort *)(puVar3 + (ulong)uVar6 + 2) << 8 |
              *(ushort *)(puVar3 + (ulong)uVar6 + 2) >> 8;
      iVar5 = iVar5 + (uint)uVar9;
      uVar7 = (uint)uVar8;
    } while (uVar9 + uVar6 + 3 < (uint)uVar8);
    if (uVar8 != 0) {
      iVar5 = 0x10d0d;
      goto LAB_00140061;
    }
    if (uVar2 < uVar9 + uVar6) {
      iVar5 = 0x10d11;
      goto LAB_00140061;
    }
  }
  if ((iVar5 <= (int)uVar2) &&
     (iVar4 = (uint)bVar1 + (uint)pPage->childPtrSize + (uint)pPage->nCell * 2 + 8, iVar4 <= iVar5))
  {
    pPage->nFree = iVar5 - iVar4 & 0xffff;
    return 0;
  }
  iVar5 = 0x10d1d;
LAB_00140061:
  iVar5 = sqlite3CorruptError(iVar5);
  return iVar5;
}

Assistant:

static int btreeComputeFreeSpace(MemPage *pPage){
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 hdr;            /* Offset to beginning of page header */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Amount of usable space on each page */
  int nFree;         /* Number of unused bytes on the page */
  int top;           /* First byte of the cell content area */
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==1 );
  assert( pPage->nFree<0 );

  usableSize = pPage->pBt->usableSize;
  hdr = pPage->hdrOffset;
  data = pPage->aData;
  /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
  ** the start of the cell content area. A zero value for this integer is
  ** interpreted as 65536. */
  top = get2byteNotZero(&data[hdr+5]);
  iCellFirst = hdr + 8 + pPage->childPtrSize + 2*pPage->nCell;
  iCellLast = usableSize - 4;

  /* Compute the total free space on the page
  ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
  ** start of the first freeblock on the page, or is zero if there are no
  ** freeblocks. */
  pc = get2byte(&data[hdr+1]);
  nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
  if( pc>0 ){
    u32 next, size;
    if( pc<top ){
      /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
      ** always be at least one cell before the first freeblock.
      */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    while( 1 ){
      if( pc>iCellLast ){
        /* Freeblock off the end of the page */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      next = get2byte(&data[pc]);
      size = get2byte(&data[pc+2]);
      nFree = nFree + size;
      if( next<=pc+size+3 ) break;
      pc = next;
    }
    if( next>0 ){
      /* Freeblock not in ascending order */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    if( pc+size>(unsigned int)usableSize ){
      /* Last freeblock extends past page end */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }

  /* At this point, nFree contains the sum of the offset to the start
  ** of the cell-content area plus the number of free bytes within
  ** the cell-content area. If this is greater than the usable-size
  ** of the page, then the page must be corrupted. This check also
  ** serves to verify that the offset to the start of the cell-content
  ** area, according to the page header, lies within the page.
  */
  if( nFree>usableSize || nFree<iCellFirst ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pPage->nFree = (u16)(nFree - iCellFirst);
  return SQLITE_OK;
}